

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void load_resets(FILE *fp)

{
  ushort uVar1;
  EXIT_DATA *pEVar2;
  byte bVar3;
  short sVar4;
  int iVar5;
  RESET_DATA *pReset;
  ROOM_INDEX_DATA *pRVar6;
  ulong uVar7;
  char *pcVar8;
  int vnum;
  uint uVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  size_t sStack_50;
  char letter;
  int local_3c;
  CLogger *local_38;
  
  if (area_last != (AREA_DATA_conflict *)0x0) {
    vnum = 0;
    local_38 = (CLogger *)&wear_locations;
    local_3c = 0;
LAB_0013f840:
    while( true ) {
      bVar3 = fread_letter(fp);
      letter = bVar3;
      if (bVar3 != 0x2a) break;
      fread_to_eol(fp);
    }
    if (bVar3 == 0x53) {
      return;
    }
    pReset = (RESET_DATA *)operator_new(0x18);
    pReset->command = bVar3;
    fread_number(fp);
    iVar5 = fread_number(fp);
    pReset->arg1 = (short)iVar5;
    iVar5 = fread_number(fp);
    pReset->arg2 = (short)iVar5;
    sVar4 = 0;
    if ((bVar3 != 0x47) && (bVar3 != 0x52)) {
      iVar5 = fread_number(fp);
      sVar4 = (short)iVar5;
    }
    pReset->arg3 = sVar4;
    uVar9 = (uint)bVar3;
    if ((bVar3 == 0x50) || (uVar9 == 0x4d)) {
      iVar5 = fread_number(fp);
      sVar4 = (short)iVar5;
    }
    else {
      sVar4 = 0;
    }
    pReset->arg4 = sVar4;
    fread_to_eol(fp);
    if (0xe < uVar9 - 0x44) {
switchD_0013f8f8_caseD_46:
      fmt_00._M_str = "Load_resets: bad command \'{}\'.";
      fmt_00._M_len = 0x1e;
      CLogger::Error<char&>((CLogger *)&wear_locations,fmt_00,&letter);
      goto LAB_0013facd;
    }
    switch(uVar9) {
    case 0x44:
      pRVar6 = get_room_index((int)pReset->arg1);
      uVar1 = pReset->arg2;
      if (((((long)(short)uVar1 < 0) || (pRVar6 == (ROOM_INDEX_DATA *)0x0)) || (5 < uVar1)) ||
         ((pEVar2 = pRVar6->exit[(short)uVar1], pEVar2 == (EXIT_DATA *)0x0 ||
          (uVar7 = pEVar2->exit_info[0], (uVar7 & 1) == 0)))) {
        pcVar8 = "Load_resets: \'D\': exit {} not door.";
        sStack_50 = 0x23;
        goto LAB_0013fac4;
      }
      sVar4 = pReset->arg3;
      if (sVar4 != 0) {
        if (sVar4 == 2) {
          uVar7 = uVar7 | 6;
        }
        else {
          if (sVar4 != 1) {
            fmt._M_str = "Load_resets: \'D\': bad \'locks\': {}.";
            fmt._M_len = 0x22;
            CLogger::Warn<short&>(local_38,fmt,&pReset->arg3);
            break;
          }
          uVar7 = uVar7 | 2;
        }
        pEVar2->exit_info[0] = uVar7;
      }
      break;
    case 0x45:
    case 0x47:
      get_obj_index((int)pReset->arg1);
      pRVar6 = get_room_index(vnum);
      if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar6,pReset);
        local_3c = vnum;
      }
      break;
    default:
      goto switchD_0013f8f8_caseD_46;
    case 0x4d:
      get_mob_index((int)pReset->arg1);
      pRVar6 = get_room_index((int)pReset->arg3);
      if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar6,pReset);
        vnum = (int)pReset->arg3;
      }
      break;
    case 0x4f:
      get_obj_index((int)pReset->arg1);
      pRVar6 = get_room_index((int)pReset->arg3);
      if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar6,pReset);
        local_3c = (int)pReset->arg3;
      }
      break;
    case 0x50:
      get_obj_index((int)pReset->arg1);
      pRVar6 = get_room_index(local_3c);
      goto LAB_0013f9c9;
    case 0x52:
      pRVar6 = get_room_index((int)pReset->arg1);
      if (6 < (ushort)pReset->arg2) goto LAB_0013faaf;
LAB_0013f9c9:
      if (pRVar6 != (ROOM_INDEX_DATA *)0x0) {
        new_reset(pRVar6,pReset);
      }
    }
    pReset->next = (RESET_DATA *)0x0;
    top_reset = top_reset + 1;
    goto LAB_0013f840;
  }
  fmt_02._M_str = "Load_resets: no #AREA seen yet.";
  fmt_02._M_len = 0x1f;
  CLogger::Error<>((CLogger *)&wear_locations,fmt_02);
LAB_0013facd:
  exit(1);
LAB_0013faaf:
  pcVar8 = "Load_resets: \'R\': bad exit {}.";
  sStack_50 = 0x1e;
LAB_0013fac4:
  fmt_01._M_str = pcVar8;
  fmt_01._M_len = sStack_50;
  CLogger::Error<short&>((CLogger *)&wear_locations,fmt_01,&pReset->arg2);
  goto LAB_0013facd;
}

Assistant:

void load_resets(FILE *fp)
{
	RESET_DATA *pReset;
	int iLastRoom = 0;
	int iLastObj = 0;

	if (!area_last)
	{
		RS.Logger.Error("Load_resets: no #AREA seen yet.");
		exit(1);
	}

	for (;;)
	{
		ROOM_INDEX_DATA *pRoomIndex;
		EXIT_DATA *pexit = nullptr;
		char letter;
		/*
		OBJ_INDEX_DATA *temp_index;
		int temp;
		*/

		letter = fread_letter(fp);

		if (letter == 'S')
			break;

		if (letter == '*')
		{
			fread_to_eol(fp);
			continue;
		}

		pReset = new RESET_DATA;
		pReset->command = letter;

		/* if_flag */ fread_number(fp);

		pReset->arg1 = fread_number(fp);
		pReset->arg2 = fread_number(fp);
		pReset->arg3 = (letter == 'G' || letter == 'R') ? 0 : fread_number(fp);
		pReset->arg4 = (letter == 'P' || letter == 'M') ? fread_number(fp) : 0;

		/*
		pReset->arg4 = (letter == 'P' || letter == 'M')
			? ((temp == 0) ? 1 : fread_number(fp))
			: 0;
		*/

		fread_to_eol(fp);

		/*
		 * Validate parameters.
		 * We're calling the index functions for the side effect.
		 */
		switch (letter)
		{
			case 'M':
				get_mob_index(pReset->arg1);

				/*
				get_room_index(pReset->arg3);
				*/

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastRoom = pReset->arg3;
				}

				break;
			case 'O':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_room_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(pReset->arg3);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = pReset->arg3;
				}

				break;
			case 'P':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				get_obj_index(pReset->arg3);
				*/

				get_obj_index(pReset->arg1);
				
				pRoomIndex = get_room_index(iLastObj);

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			case 'G':
			case 'E':
				/*
				temp_index = get_obj_index(pReset->arg1);
				temp_index->reset_num++;
				*/

				get_obj_index(pReset->arg1);

				pRoomIndex = get_room_index(iLastRoom);

				if (pRoomIndex)
				{
					new_reset(pRoomIndex, pReset);
					iLastObj = iLastRoom;
				}

				break;
			case 'D':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0
					|| pReset->arg2 > 5
					|| !pRoomIndex
					|| !(pexit = pRoomIndex->exit[pReset->arg2])
					|| !IS_SET(pexit->exit_info, EX_ISDOOR))
				{
					RS.Logger.Error("Load_resets: 'D': exit {} not door.", pReset->arg2);
					exit(1);
				}

				/*
				if (pReset->arg3 < 0 || pReset->arg3 > 2)
				{
					RS.Logger.Error("Load_resets: 'D': bad 'locks': %d.", pReset->arg3);
					exit(1);
				}
				*/

				switch (pReset->arg3)
				{
					case 0:
						break;
					case 1:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						break;
					case 2:
						SET_BIT(pexit->exit_info, EX_CLOSED);
						SET_BIT(pexit->exit_info, EX_LOCKED);
						break;
					default:
						RS.Logger.Warn("Load_resets: 'D': bad 'locks': {}.", pReset->arg3);
						break;
				}

				break;
			case 'R':
				pRoomIndex = get_room_index(pReset->arg1);

				if (pReset->arg2 < 0 || pReset->arg2 > 6)
				{
					RS.Logger.Error("Load_resets: 'R': bad exit {}.", pReset->arg2);
					exit(1);
				}

				if (pRoomIndex)
					new_reset(pRoomIndex, pReset);

				break;
			default:
				RS.Logger.Error("Load_resets: bad command '{}'.", letter);
				exit(1);
				break;
		}

		/*
		if (area_last->reset_first == nullptr)
			area_last->reset_first = pReset;
	
		if (area_last->reset_last != nullptr)
			area_last->reset_last->next	= pReset;

		area_last->reset_last = pReset;
		*/
		pReset->next = nullptr;
		top_reset++;
	}
}